

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O0

ssize_t __thiscall crnlib::buffer_stream::write(buffer_stream *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  uint bytes_left;
  uint len_local;
  void *pBuf_local;
  buffer_stream *this_local;
  
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_writable(&this->super_data_stream), !bVar1)) || ((uint)__buf == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = math::minimum<unsigned_int>((uint)__buf,this->m_size - this->m_ofs);
    if (this_local._4_4_ != 0) {
      memcpy(this->m_pBuf + this->m_ofs,(void *)CONCAT44(in_register_00000034,__fd),
             (ulong)this_local._4_4_);
    }
    this->m_ofs = this_local._4_4_ + this->m_ofs;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

virtual uint write(const void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if ((!m_opened) || (!is_writable()) || (!len))
            {
                return 0;
            }

            CRNLIB_ASSERT(m_ofs <= m_size);

            uint bytes_left = m_size - m_ofs;

            len = math::minimum<uint>(len, bytes_left);

            if (len)
            {
                memcpy(&m_pBuf[m_ofs], pBuf, len);
            }

            m_ofs += len;

            return len;
        }